

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_type.cpp
# Opt level: O2

void duckdb::VectorTypeFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  undefined1 (*pauVar1) [16];
  reference pvVar2;
  undefined1 auVar3 [16];
  string sStack_38;
  
  duckdb::Vector::SetVectorType((VectorType)result);
  pauVar1 = *(undefined1 (**) [16])(result + 0x20);
  pvVar2 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)input,0);
  EnumUtil::ToString<duckdb::VectorType>(&sStack_38,(VectorType)*pvVar2);
  auVar3 = duckdb::StringVector::AddString(result,(string *)&sStack_38);
  *pauVar1 = auVar3;
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

static void VectorTypeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	auto data = ConstantVector::GetData<string_t>(result);
	data[0] = StringVector::AddString(result, EnumUtil::ToString(input.data[0].GetVectorType()));
}